

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void duckdb_brotli::BrotliStoreMetaBlockFast
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,BrotliEncoderParams *params,Command *commands,size_t n_commands,
               size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  HistogramLiteral *lit_histo;
  size_t in_RDX;
  uint8_t *in_RSI;
  ulong in_R8;
  int in_R9D;
  long in_stack_00000008;
  Command *in_stack_00000010;
  ulong in_stack_00000018;
  size_t *in_stack_00000020;
  uint8_t *in_stack_00000028;
  size_t *in_stack_00000030;
  uint8_t *in_stack_00000038;
  size_t j;
  Command cmd;
  size_t i;
  size_t num_literals;
  size_t pos;
  uint32_t histogram [256];
  uint32_t distance_alphabet_bits;
  uint32_t num_distance_symbols;
  MetablockArena *arena;
  uint64_t v;
  uint8_t *p;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v_3;
  uint8_t *p_3;
  size_t in_stack_fffffffffffff9e8;
  uint32_t *lit_bits;
  MemoryManager *in_stack_fffffffffffff9f0;
  undefined1 *m_00;
  uint8_t *in_stack_fffffffffffff9f8;
  size_t *in_stack_fffffffffffffa00;
  size_t in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa10;
  int is_final_block;
  ulong local_5d8;
  uint uStack_5cc;
  ulong local_5c0;
  size_t local_5b0;
  int local_5a8 [16];
  uint16_t *in_stack_fffffffffffffa98;
  uint8_t *in_stack_fffffffffffffaa0;
  size_t in_stack_fffffffffffffaa8;
  size_t in_stack_fffffffffffffab0;
  uint32_t *in_stack_fffffffffffffab8;
  HuffmanTree *in_stack_fffffffffffffac0;
  
  is_final_block = (int)((ulong)in_stack_fffffffffffffa10 >> 0x20);
  lit_histo = (HistogramLiteral *)
              BrotliAllocate(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  uVar3 = *(int *)(in_stack_00000008 + 0x40) - 1;
  iVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  StoreCompressedMetaBlockHeader
            (is_final_block,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             in_stack_fffffffffffff9f8);
  *(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3)) =
       0L << ((byte)*in_stack_00000020 & 7) |
       (ulong)(byte)*(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3));
  *in_stack_00000020 = *in_stack_00000020 + 0xd;
  if (in_stack_00000018 < 0x81) {
    memset(local_5a8,0,0x400);
    local_5b0 = in_RDX;
    for (local_5c0 = 0; local_5c0 < in_stack_00000018; local_5c0 = local_5c0 + 1) {
      uVar1._0_4_ = in_stack_00000010[local_5c0].insert_len_;
      uVar1._4_4_ = in_stack_00000010[local_5c0].copy_len_;
      for (local_5d8 = uVar1 & 0xffffffff; local_5d8 != 0; local_5d8 = local_5d8 - 1) {
        local_5a8[in_RSI[local_5b0 & in_R8]] = local_5a8[in_RSI[local_5b0 & in_R8]] + 1;
        local_5b0 = local_5b0 + 1;
      }
      local_5b0 = (uVar1._4_4_ & 0x1ffffff) + local_5b0;
    }
    BrotliBuildAndStoreHuffmanTreeFast
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
               in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
               in_stack_00000030,in_stack_00000038);
    *(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3)) =
         0x92624416307003 << ((byte)*in_stack_00000020 & 7) |
         (ulong)(byte)*(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3));
    *in_stack_00000020 = *in_stack_00000020 + 0x38;
    *(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3)) =
         0L << ((byte)*in_stack_00000020 & 7) |
         (ulong)(byte)*(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3));
    *in_stack_00000020 = *in_stack_00000020 + 3;
    *(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3)) =
         0x369dc03L << ((byte)*in_stack_00000020 & 7) |
         (ulong)(byte)*(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3));
    *in_stack_00000020 = *in_stack_00000020 + 0x1c;
    lit_bits = lit_histo[6].data_ + 0x14;
    m_00 = kStaticCommandCodeDepth;
    StoreDataWithHuffmanCodes
              (in_RSI,in_RDX,in_R8,in_stack_00000010,in_stack_00000018,
               (uint8_t *)(lit_histo[5].data_ + 0xd8),(uint16_t *)lit_bits,kStaticCommandCodeDepth,
               (uint16_t *)kStaticCommandCodeBits,kStaticDistanceCodeDepth,
               (uint16_t *)kStaticDistanceCodeBits,in_stack_00000020,in_stack_00000028);
  }
  else {
    memset(lit_histo,0,0x400);
    lit_histo->total_count_ = 0;
    lit_histo->bit_cost_ = INFINITY;
    memset(lit_histo + 1,0,0xb00);
    lit_histo[3].data_[0xb8] = 0;
    lit_histo[3].data_[0xb9] = 0;
    lit_histo[3].data_[0xba] = 0;
    lit_histo[3].data_[0xbb] = 0x7ff00000;
    memset(lit_histo[3].data_ + 0xbc,0,0x880);
    lit_histo[5].data_[0xd4] = 0;
    lit_histo[5].data_[0xd5] = 0;
    lit_histo[5].data_[0xd6] = 0;
    lit_histo[5].data_[0xd7] = 0x7ff00000;
    BuildHistograms(in_RSI,in_RDX,in_R8,in_stack_00000010,in_stack_00000018,lit_histo,
                    (HistogramCommand *)(lit_histo + 1),
                    (HistogramDistance *)(lit_histo[3].data_ + 0xbc));
    BrotliBuildAndStoreHuffmanTreeFast
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
               in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
               in_stack_00000030,in_stack_00000038);
    BrotliBuildAndStoreHuffmanTreeFast
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
               in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
               in_stack_00000030,in_stack_00000038);
    BrotliBuildAndStoreHuffmanTreeFast
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
               in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
               in_stack_00000030,in_stack_00000038);
    lit_bits = lit_histo[6].data_ + 0x14;
    m_00 = (undefined1 *)(lit_histo[6].data_ + 0x94);
    StoreDataWithHuffmanCodes
              (in_RSI,in_RDX,in_R8,in_stack_00000010,in_stack_00000018,
               (uint8_t *)(lit_histo[5].data_ + 0xd8),(uint16_t *)lit_bits,m_00,
               (uint16_t *)(lit_histo[7].data_ + 0x40),(uint8_t *)(lit_histo[8].data_ + 0x9c),
               (uint16_t *)(lit_histo[8].data_ + 0xbf),in_stack_00000020,in_stack_00000028);
  }
  BrotliFree((MemoryManager *)m_00,lit_bits);
  if (in_R9D != 0) {
    JumpToByteBoundary(in_stack_00000020,in_stack_00000028);
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreMetaBlockFast(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    BROTLI_BOOL is_last, const BrotliEncoderParams* params,
    const Command* commands, size_t n_commands,
    size_t* storage_ix, uint8_t* storage) {
  MetablockArena* arena = BROTLI_ALLOC(m, MetablockArena, 1);
  uint32_t num_distance_symbols = params->dist.alphabet_size_max;
  uint32_t distance_alphabet_bits =
      Log2FloorNonZero(num_distance_symbols - 1) + 1;
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(arena)) return;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  BrotliWriteBits(13, 0, storage_ix, storage);

  if (n_commands <= 128) {
    uint32_t histogram[BROTLI_NUM_LITERAL_SYMBOLS] = { 0 };
    size_t pos = start_pos;
    size_t num_literals = 0;
    size_t i;
    for (i = 0; i < n_commands; ++i) {
      const Command cmd = commands[i];
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        ++histogram[input[pos & mask]];
        ++pos;
      }
      num_literals += cmd.insert_len_;
      pos += CommandCopyLen(&cmd);
    }
    BrotliBuildAndStoreHuffmanTreeFast(arena->tree, histogram, num_literals,
                                       /* max_bits = */ 8,
                                       arena->lit_depth, arena->lit_bits,
                                       storage_ix, storage);
    StoreStaticCommandHuffmanTree(storage_ix, storage);
    StoreStaticDistanceHuffmanTree(storage_ix, storage);
    StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                              n_commands, arena->lit_depth, arena->lit_bits,
                              kStaticCommandCodeDepth,
                              kStaticCommandCodeBits,
                              kStaticDistanceCodeDepth,
                              kStaticDistanceCodeBits,
                              storage_ix, storage);
  } else {
    HistogramClearLiteral(&arena->lit_histo);
    HistogramClearCommand(&arena->cmd_histo);
    HistogramClearDistance(&arena->dist_histo);
    BuildHistograms(input, start_pos, mask, commands, n_commands,
                    &arena->lit_histo, &arena->cmd_histo, &arena->dist_histo);
    BrotliBuildAndStoreHuffmanTreeFast(arena->tree, arena->lit_histo.data_,
                                       arena->lit_histo.total_count_,
                                       /* max_bits = */ 8,
                                       arena->lit_depth, arena->lit_bits,
                                       storage_ix, storage);
    BrotliBuildAndStoreHuffmanTreeFast(arena->tree, arena->cmd_histo.data_,
                                       arena->cmd_histo.total_count_,
                                       /* max_bits = */ 10,
                                       arena->cmd_depth, arena->cmd_bits,
                                       storage_ix, storage);
    BrotliBuildAndStoreHuffmanTreeFast(arena->tree, arena->dist_histo.data_,
                                       arena->dist_histo.total_count_,
                                       /* max_bits = */
                                       distance_alphabet_bits,
                                       arena->dist_depth, arena->dist_bits,
                                       storage_ix, storage);
    StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                              n_commands, arena->lit_depth, arena->lit_bits,
                              arena->cmd_depth, arena->cmd_bits,
                              arena->dist_depth, arena->dist_bits,
                              storage_ix, storage);
  }

  BROTLI_FREE(m, arena);

  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}